

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O2

void __thiscall musicBlock::OPLpitchWheel(musicBlock *this,uint channel,int pitch)

{
  int pitch_00;
  int iVar1;
  channelEntry *pcVar2;
  ulong uVar3;
  
  iVar1 = (int)((uint)(this->driverdata).channelPitchSens[channel] * (pitch + -0x2000)) / 0x6400 +
          0x40;
  (this->driverdata).channelPitch[channel] = (schar)iVar1;
  pcVar2 = this->channels;
  for (uVar3 = 0; uVar3 < this->io->OPLchannels; uVar3 = uVar3 + 1) {
    if (pcVar2->channel == channel) {
      pcVar2->time = this->MLtime;
      pitch_00 = pcVar2->finetune + iVar1;
      pcVar2->pitch = pitch_00;
      writeFrequency(this,(uint)uVar3,(uint)pcVar2->realnote,pitch_00,1);
    }
    pcVar2 = pcVar2 + 1;
  }
  return;
}

Assistant:

void musicBlock::OPLpitchWheel(uint channel, int pitch)
{
	uint i;
	uint id = channel;

	// Convert pitch from 14-bit to 7-bit, then scale it, since the player
	// code only understands sensitivities of 2 semitones.
	pitch = (pitch - 8192) * driverdata.channelPitchSens[channel] / (200 * 128) + 64;
	driverdata.channelPitch[channel] = pitch;
	for(i = 0; i < io->OPLchannels; i++)
	{
		struct channelEntry *ch = &channels[i];
		if (ch->channel == id)
		{
			ch->time = MLtime;
			ch->pitch = ch->finetune + pitch;
			writeFrequency(i, ch->realnote, ch->pitch, 1);
		}
	}
}